

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredmesh.cc
# Opt level: O3

void __thiscall
gvr::ColoredMesh::resizeVertexList(ColoredMesh *this,int vn,bool with_scanprop,bool with_scanpos)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  int iVar5;
  ulong uVar6;
  
  iVar3 = vn * 3;
  iVar5 = -1;
  if (-1 < vn) {
    iVar5 = iVar3;
  }
  puVar4 = (uchar *)operator_new__((long)iVar5);
  iVar5 = (this->super_Mesh).super_PointCloud.n;
  if (vn <= iVar5) {
    iVar5 = vn;
  }
  uVar2 = iVar5 * 3;
  if (0 < iVar5) {
    puVar1 = this->rgb;
    iVar5 = uVar2 + 1;
    uVar6 = (ulong)(uVar2 - 1);
    do {
      puVar4[uVar6] = puVar1[uVar6];
      iVar5 = iVar5 + -1;
      uVar6 = uVar6 - 1;
    } while (1 < iVar5);
  }
  if (SBORROW4(uVar2,iVar3) != (int)(uVar2 + vn * -3) < 0) {
    memset(puVar4 + (int)uVar2,0,(ulong)(iVar3 + ~uVar2) + 1);
  }
  if (this->rgb != (uchar *)0x0) {
    operator_delete__(this->rgb);
  }
  this->rgb = puVar4;
  Mesh::resizeVertexList(&this->super_Mesh,vn,with_scanprop,with_scanpos);
  return;
}

Assistant:

void ColoredMesh::resizeVertexList(int vn, bool with_scanprop, bool with_scanpos)
{
  unsigned char *p=new unsigned char [3*vn];

  for (int i=3*std::min(getVertexCount(), vn)-1; i>=0; i--)
  {
    p[i]=rgb[i];
  }

  for (int i=3*std::min(getVertexCount(), vn); i<3*vn; i++)
  {
    p[i]=0;
  }

  delete [] rgb;

  rgb=p;

  Mesh::resizeVertexList(vn, with_scanprop, with_scanpos);
}